

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O2

QVariant * __thiscall
QSpinBoxPrivate::calculateAdaptiveDecimalStep
          (QVariant *__return_storage_ptr__,QSpinBoxPrivate *this,int steps)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  __type_conflict1 _Var4;
  double dVar5;
  
  uVar1 = ::QVariant::toInt((bool *)&(this->super_QAbstractSpinBoxPrivate).value);
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  if (uVar2 < 100) {
    iVar3 = 1;
  }
  else {
    _Var4 = std::log10<int>(((int)(uVar1 ^ steps) >> 0x1f) + uVar2);
    dVar5 = pow(10.0,(double)((int)_Var4 + -1));
    iVar3 = (int)dVar5;
  }
  ::QVariant::QVariant(__return_storage_ptr__,iVar3);
  return __return_storage_ptr__;
}

Assistant:

QVariant QSpinBoxPrivate::calculateAdaptiveDecimalStep(int steps) const
{
    const int intValue = value.toInt();
    const int absValue = qAbs(intValue);

    if (absValue < 100)
        return 1;

    const bool valueNegative = intValue < 0;
    const bool stepsNegative = steps < 0;
    const int signCompensation = (valueNegative == stepsNegative) ? 0 : 1;

    const int log = static_cast<int>(std::log10(absValue - signCompensation)) - 1;
    return static_cast<int>(std::pow(10, log));
}